

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSim.c
# Opt level: O2

int Saig_ManSimDataInit2(Aig_Man_t *p,Abc_Cex_t *pCex,Vec_Ptr_t *vSimInfo)

{
  uint uVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pObj;
  int iFrame;
  int i;
  int iVar3;
  uint uVar4;
  
  for (uVar4 = 0; (int)uVar4 < p->nRegs; uVar4 = uVar4 + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,p->nTruePis + uVar4);
    Saig_ManSimInfo2Set(vSimInfo,pAVar2,0,
                        (uint)(((uint)(&pCex[1].iPo)[uVar4 >> 5] >> (uVar4 & 0x1f) & 1) != 0));
  }
  iVar3 = 0;
  while (iFrame = iVar3, iFrame <= pCex->iFrame) {
    Saig_ManSimInfo2Set(vSimInfo,p->pConst1,iFrame,1);
    for (iVar3 = 0; uVar1 = uVar4 + iVar3, iVar3 < p->nTruePis; iVar3 = iVar3 + 1) {
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,iVar3);
      Saig_ManSimInfo2Set(vSimInfo,pAVar2,iFrame,
                          (uint)(((uint)(&pCex[1].iPo)[(int)uVar1 >> 5] >> (uVar1 & 0x1f) & 1) != 0)
                         );
    }
    for (iVar3 = 0; iVar3 < p->vObjs->nSize; iVar3 = iVar3 + 1) {
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,iVar3);
      if ((pAVar2 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar2->field_0x18 & 7) - 7)) {
        Saig_ManExtendOneEval2(vSimInfo,pAVar2,iFrame);
      }
    }
    for (iVar3 = 0; iVar3 < p->vCos->nSize; iVar3 = iVar3 + 1) {
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,iVar3);
      Saig_ManExtendOneEval2(vSimInfo,pAVar2,iFrame);
    }
    if (iFrame == pCex->iFrame) break;
    for (i = 0; uVar4 = uVar1, iVar3 = iFrame + 1, i < p->nRegs; i = i + 1) {
      pAVar2 = Saig_ManLi(p,i);
      pObj = Saig_ManLo(p,i);
      iVar3 = Saig_ManSimInfo2Get(vSimInfo,pAVar2,iFrame);
      Saig_ManSimInfo2Set(vSimInfo,pObj,iFrame + 1,iVar3);
    }
  }
  pAVar2 = Aig_ManCo(p,pCex->iPo);
  iVar3 = Saig_ManSimInfo2Get(vSimInfo,pAVar2,pCex->iFrame);
  return iVar3;
}

Assistant:

int Saig_ManSimDataInit2( Aig_Man_t * p, Abc_Cex_t * pCex, Vec_Ptr_t * vSimInfo )
{
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int i, f, iBit = 0;
    Saig_ManForEachLo( p, pObj, i )
        Saig_ManSimInfo2Set( vSimInfo, pObj, 0, Abc_InfoHasBit(pCex->pData, iBit++)?SAIG_ONE_NEW:SAIG_ZER_NEW );
    for ( f = 0; f <= pCex->iFrame; f++ )
    {
        Saig_ManSimInfo2Set( vSimInfo, Aig_ManConst1(p), f, SAIG_ONE_NEW );
        Saig_ManForEachPi( p, pObj, i )
            Saig_ManSimInfo2Set( vSimInfo, pObj, f, Abc_InfoHasBit(pCex->pData, iBit++)?SAIG_ONE_NEW:SAIG_ZER_NEW );
        Aig_ManForEachNode( p, pObj, i )
            Saig_ManExtendOneEval2( vSimInfo, pObj, f );
        Aig_ManForEachCo( p, pObj, i )
            Saig_ManExtendOneEval2( vSimInfo, pObj, f );
        if ( f == pCex->iFrame )
            break;
        Saig_ManForEachLiLo( p, pObjLi, pObjLo, i )
            Saig_ManSimInfo2Set( vSimInfo, pObjLo, f+1, Saig_ManSimInfo2Get(vSimInfo, pObjLi, f) );
    }
    // make sure the output of the property failed
    pObj = Aig_ManCo( p, pCex->iPo );
    return Saig_ManSimInfo2Get( vSimInfo, pObj, pCex->iFrame );
}